

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenSwitch(BinaryenModuleRef module,char **names,BinaryenIndex numNames,char *defaultName,
              BinaryenExpressionRef condition,BinaryenExpressionRef value)

{
  Switch *pSVar1;
  ulong uVar2;
  ArenaVector<wasm::Name> *this;
  Name local_70;
  string_view local_60;
  BinaryenExpressionRef local_50;
  BinaryenExpressionRef local_48;
  Switch *local_40;
  char *local_38;
  
  local_50 = value;
  local_48 = condition;
  local_38 = defaultName;
  local_40 = MixedArena::alloc<wasm::Switch>(&module->allocator);
  this = &local_40->targets;
  for (uVar2 = 0; numNames != uVar2; uVar2 = uVar2 + 1) {
    wasm::Name::Name((Name *)&local_60,names[uVar2]);
    ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::push_back
              (&this->super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,(Name)local_60);
  }
  wasm::Name::Name(&local_70,local_38);
  pSVar1 = local_40;
  (local_40->default_).super_IString.str._M_len = local_70.super_IString.str._M_len;
  (local_40->default_).super_IString.str._M_str = local_70.super_IString.str._M_str;
  local_40->condition = local_48;
  local_40->value = local_50;
  wasm::Switch::finalize(local_40);
  return (BinaryenExpressionRef)pSVar1;
}

Assistant:

BinaryenExpressionRef BinaryenSwitch(BinaryenModuleRef module,
                                     const char** names,
                                     BinaryenIndex numNames,
                                     const char* defaultName,
                                     BinaryenExpressionRef condition,
                                     BinaryenExpressionRef value) {
  auto* ret = ((Module*)module)->allocator.alloc<Switch>();
  for (BinaryenIndex i = 0; i < numNames; i++) {
    ret->targets.push_back(names[i]);
  }
  ret->default_ = defaultName;
  ret->condition = (Expression*)condition;
  ret->value = (Expression*)value;
  ret->finalize();
  return static_cast<Expression*>(ret);
}